

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_chunk_append(uchar **out,size_t *outlength,uchar *chunk)

{
  ulong uVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = lodepng_read32bitInt(chunk);
  uVar5 = (ulong)(uVar2 + 0xc);
  uVar1 = *outlength;
  if (CARRY8(uVar1,uVar5)) {
    uVar2 = 0x4d;
  }
  else {
    puVar3 = (uchar *)realloc(*out,uVar1 + uVar5);
    if (puVar3 == (uchar *)0x0) {
      uVar2 = 0x53;
    }
    else {
      *out = puVar3;
      *outlength = uVar1 + uVar5;
      uVar2 = 0;
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        puVar3[uVar4 + uVar1] = chunk[uVar4];
      }
    }
  }
  return uVar2;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outlength, const unsigned char* chunk) {
  unsigned i;
  unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
  unsigned char *chunk_start, *new_buffer;
  size_t new_length = (*outlength) + total_chunk_length;
  if(new_length < total_chunk_length || new_length < (*outlength)) return 77; /*integer overflow happened*/

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}